

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

bool __thiscall DataSourceAmiga::check(DataSourceAmiga *this)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  Stream *this_00;
  long *plVar4;
  pointer pbVar5;
  long lVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string cp;
  __string_type __str;
  string file_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  ostream *local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"gfxheader","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"gfxfast","");
  plVar3 = local_58;
  local_68[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"gfxchip","");
  __l._M_len = 3;
  __l._M_array = &local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_108);
  lVar6 = -0x60;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  bVar7 = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar7) {
    pbVar5 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,pcVar1 + pbVar5->_M_string_length);
      local_e8._0_8_ = local_e8 + 0x10;
      pcVar1 = (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar1,
                 pcVar1 + (this->super_DataSourceLegacy).super_DataSourceBase.path._M_string_length)
      ;
      std::__cxx11::string::_M_replace_aux((ulong)local_e8,local_e8._8_8_,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_e8,(ulong)local_a8._M_dataplus._M_p);
      local_108 = &local_f8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_f8 = *plVar4;
        lStack_f0 = plVar3[3];
      }
      else {
        local_f8 = *plVar4;
        local_108 = (long *)*plVar3;
      }
      local_100 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      }
      local_c8._M_allocated_capacity = (size_type)(local_e8 + 0x30);
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"data","");
      Log::Logger::operator[]((Logger *)local_e8,(string *)&Log::Info);
      this_00 = Log::Stream::operator<<((Stream *)local_e8,"Looking for game data in \'");
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00->stream,(char *)local_108,local_100);
      Log::Stream::operator<<(this_00,"\'...");
      Log::Stream::~Stream((Stream *)local_e8);
      if ((undefined1 *)local_c8._M_allocated_capacity != local_e8 + 0x30) {
        operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8[0] + 1));
      }
      iVar2 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                        (this,&local_108);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar2 == '\0') break;
      pbVar5 = pbVar5 + 1;
      bVar7 = pbVar5 == local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar7;
}

Assistant:

bool
DataSourceAmiga::check() {
  std::vector<std::string> data_files = {
    "gfxheader",  // catalog file
    "gfxfast",    // fast graphics file
    "gfxchip"     // chip graphics file
  };

  for (std::string file_name : data_files) {
    std::string cp = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << cp << "'...";
    if (!check_file(cp)) {
      return false;
    }
  }

  return true;
}